

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

bool __thiscall QGroupBox::event(QGroupBox *this,QEvent *e)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  QGroupBoxPrivate *pQVar6;
  QWidget *pQVar7;
  QStyle *pQVar8;
  QEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  QPointF QVar10;
  bool toggle;
  QKeyEvent *k_1;
  QKeyEvent *k;
  bool oldHover;
  SubControl control;
  QShortcutEvent *se;
  QGroupBoxPrivate *d;
  QRect rect_1;
  QRect rect;
  QStyleOptionGroupBox box;
  QWidget *in_stack_fffffffffffffe48;
  undefined5 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe55;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  QGroupBoxPrivate *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined8 in_stack_fffffffffffffe68;
  FocusReason reason;
  QGroupBoxPrivate *in_stack_fffffffffffffe70;
  FocusReason reason_00;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  bool local_121;
  undefined1 local_110 [16];
  QRect local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  QRect local_d0;
  undefined1 local_c0 [16];
  qreal local_b0;
  qreal local_a8;
  QPoint local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QEvent *event;
  
  reason = (FocusReason)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QGroupBox *)0x5a42be);
  TVar4 = QEvent::type(in_RSI);
  if ((TVar4 == Shortcut) &&
     (iVar5 = QShortcutEvent::shortcutId((QShortcutEvent *)in_RSI), iVar5 == pQVar6->shortcutId)) {
    bVar3 = isCheckable((QGroupBox *)
                        CONCAT17(in_stack_fffffffffffffe57,
                                 CONCAT16(in_stack_fffffffffffffe56,
                                          CONCAT15(in_stack_fffffffffffffe55,
                                                   in_stack_fffffffffffffe50))));
    reason_00 = (FocusReason)((ulong)in_RDI >> 0x20);
    if (bVar3) {
      QGroupBoxPrivate::click(in_stack_fffffffffffffe58);
      QWidget::setFocus((QWidget *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                        reason_00);
    }
    else {
      QGroupBoxPrivate::_q_fixFocus(in_stack_fffffffffffffe70,reason);
    }
    local_121 = true;
    goto LAB_005a4842;
  }
  event = (QEvent *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)0x5a43b0);
  (**(code **)(*in_RDI + 0x1a0))(in_RDI,&local_98);
  TVar4 = QEvent::type(in_RSI);
  QVar2.x2.m_i = local_100.x2.m_i;
  QVar2.y2.m_i = local_100.y2.m_i;
  QVar2.x1.m_i = local_100.x1.m_i;
  QVar2.y1.m_i = local_100.y1.m_i;
  if (TVar4 == KeyPress) {
    bVar3 = QGroupBoxPrivate::shouldHandleKeyEvent
                      (in_stack_fffffffffffffe58,
                       (QKeyEvent *)
                       CONCAT17(in_stack_fffffffffffffe57,
                                CONCAT16(in_stack_fffffffffffffe56,
                                         CONCAT15(in_stack_fffffffffffffe55,
                                                  in_stack_fffffffffffffe50))));
    if (bVar3) {
      pQVar6->pressedControl = SC_ComboBoxFrame;
      pQVar8 = QWidget::style(in_stack_fffffffffffffe48);
      (**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,7,&local_98,1,in_RDI);
      QWidget::update((QWidget *)in_stack_fffffffffffffe58,
                      (QRect *)CONCAT17(in_stack_fffffffffffffe57,
                                        CONCAT16(in_stack_fffffffffffffe56,
                                                 CONCAT15(in_stack_fffffffffffffe55,
                                                          in_stack_fffffffffffffe50))));
      local_121 = true;
    }
    else {
LAB_005a4812:
      local_121 = QWidget::event(pQVar7,event);
    }
  }
  else if (TVar4 == KeyRelease) {
    bVar3 = QGroupBoxPrivate::shouldHandleKeyEvent
                      (in_stack_fffffffffffffe58,
                       (QKeyEvent *)
                       CONCAT17(in_stack_fffffffffffffe57,
                                CONCAT16(in_stack_fffffffffffffe56,
                                         CONCAT15(in_stack_fffffffffffffe55,
                                                  in_stack_fffffffffffffe50))));
    if (!bVar3) goto LAB_005a4812;
    in_stack_fffffffffffffe56 = true;
    if (pQVar6->pressedControl != SC_ComboBoxEditField) {
      in_stack_fffffffffffffe56 = pQVar6->pressedControl == SC_ComboBoxFrame;
    }
    pQVar6->pressedControl = SC_None;
    if ((bool)in_stack_fffffffffffffe56 != false) {
      QGroupBoxPrivate::click(in_stack_fffffffffffffe58);
    }
    local_121 = true;
  }
  else {
    if (TVar4 != HoverEnter) {
      if (TVar4 == HoverLeave) {
        pQVar6->hover = false;
        local_100 = QVar2;
        if ((pQVar6->checkable & 1U) != 0) {
          local_f0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar8 = QWidget::style(in_stack_fffffffffffffe48);
          local_100 = (QRect)(**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,7,&local_98,1,in_RDI);
          pQVar8 = QWidget::style(in_stack_fffffffffffffe48);
          local_110 = (**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,7,&local_98,2,in_RDI);
          local_f0 = QRect::operator|(&local_100,(QRect *)local_110);
          QWidget::update((QWidget *)in_stack_fffffffffffffe58,
                          (QRect *)CONCAT17(in_stack_fffffffffffffe57,
                                            CONCAT16(in_stack_fffffffffffffe56,
                                                     CONCAT15(in_stack_fffffffffffffe55,
                                                              in_stack_fffffffffffffe50))));
        }
        local_121 = true;
        goto LAB_005a4835;
      }
      if (TVar4 != HoverMove) goto LAB_005a4812;
    }
    pQVar7 = (QWidget *)QWidget::style(in_stack_fffffffffffffe48);
    QVar10 = QSinglePointEvent::position((QSinglePointEvent *)0x5a443c);
    local_a8 = QVar10.yp;
    local_b0 = QVar10.xp;
    local_a0 = QPointF::toPoint((QPointF *)
                                CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    iVar5 = (**(code **)(*(long *)pQVar7 + 0xd0))(pQVar7,7,&local_98,&local_a0,in_RDI);
    bVar3 = pQVar6->hover;
    bVar9 = (pQVar6->checkable & 1U) != 0;
    if (bVar9) {
      in_stack_fffffffffffffe57 = iVar5 == 2 || iVar5 == 1;
    }
    pQVar6->hover = bVar9 && (iVar5 == 2 || iVar5 == 1);
    if ((bVar3 & 1U) != (pQVar6->hover & 1U)) {
      local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar8 = QWidget::style(in_stack_fffffffffffffe48);
      local_d0 = (QRect)(**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,7,&local_98,1,in_RDI);
      pQVar8 = QWidget::style(in_stack_fffffffffffffe48);
      local_e0 = (**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,7,&local_98,2,in_RDI);
      local_c0 = QRect::operator|(&local_d0,(QRect *)local_e0);
      QWidget::update(pQVar7,(QRect *)CONCAT17(in_stack_fffffffffffffe57,
                                               CONCAT16(in_stack_fffffffffffffe56,
                                                        CONCAT15(in_stack_fffffffffffffe55,
                                                                 in_stack_fffffffffffffe50))));
    }
    local_121 = true;
  }
LAB_005a4835:
  QStyleOptionGroupBox::~QStyleOptionGroupBox
            ((QStyleOptionGroupBox *)
             CONCAT17(in_stack_fffffffffffffe57,
                      CONCAT16(in_stack_fffffffffffffe56,
                               CONCAT15(in_stack_fffffffffffffe55,in_stack_fffffffffffffe50))));
LAB_005a4842:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_121;
  }
  __stack_chk_fail();
}

Assistant:

bool QGroupBox::event(QEvent *e)
{
    Q_D(QGroupBox);
#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            if (!isCheckable()) {
                d->_q_fixFocus(Qt::ShortcutFocusReason);
            } else {
                d->click();
                setFocus(Qt::ShortcutFocusReason);
            }
            return true;
        }
    }
#endif
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    switch (e->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverMove: {
        QStyle::SubControl control = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                    static_cast<QHoverEvent *>(e)->position().toPoint(),
                                                                    this);
        bool oldHover = d->hover;
        d->hover = d->checkable && (control == QStyle::SC_GroupBoxLabel || control == QStyle::SC_GroupBoxCheckBox);
        if (oldHover != d->hover) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    }
    case QEvent::HoverLeave:
        d->hover = false;
        if (d->checkable) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            d->pressedControl = QStyle::SC_GroupBoxCheckBox;
            update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
            return true;
        }
        break;
    }
    case QEvent::KeyRelease: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            bool toggle = (d->pressedControl == QStyle::SC_GroupBoxLabel
                           || d->pressedControl == QStyle::SC_GroupBoxCheckBox);
            d->pressedControl = QStyle::SC_None;
            if (toggle)
                d->click();
            return true;
        }
        break;
    }
    default:
        break;
    }
    return QWidget::event(e);
}